

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateBuilder
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  ClassNameResolver *in_RDI;
  MessageBuilderLiteGenerator builderGenerator;
  Printer *in_stack_00000198;
  MessageBuilderLiteGenerator *in_stack_000001a0;
  Descriptor *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  char (*in_stack_ffffffffffffffb0) [10];
  char *in_stack_ffffffffffffffb8;
  Printer *in_stack_ffffffffffffffc0;
  Context *in_stack_ffffffffffffffd0;
  Descriptor *in_stack_ffffffffffffffd8;
  MessageBuilderLiteGenerator *in_stack_ffffffffffffffe0;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (in_RDI,in_stack_ffffffffffffff60);
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  MessageBuilderLiteGenerator::Generate(in_stack_000001a0,in_stack_00000198);
  MessageBuilderLiteGenerator::~MessageBuilderLiteGenerator((MessageBuilderLiteGenerator *)0x54a0db)
  ;
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  MessageBuilderLiteGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}